

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_config.cxx
# Opt level: O3

ptr<srv_config> __thiscall nuraft::srv_config::deserialize(srv_config *this,buffer_serializer *bs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *__s;
  char *__s_00;
  size_t sVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ptr<srv_config> pVar5;
  byte is_learner;
  undefined1 local_75;
  int32 dc_id;
  int32 id;
  int32 priority;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  id = buffer_serializer::get_i32(bs);
  dc_id = buffer_serializer::get_i32(bs);
  __s = buffer_serializer::get_cstr(bs);
  __s_00 = buffer_serializer::get_cstr(bs);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  if (__s == (char *)0x0) {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
  }
  else {
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar3);
  }
  paVar2 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar2;
  if (__s_00 == (char *)0x0) {
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
  }
  else {
    sVar3 = strlen(__s_00);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s_00,__s_00 + sVar3);
  }
  is_learner = buffer_serializer::get_u8(bs);
  priority = buffer_serializer::get_i32(bs);
  this->id_ = 0;
  this->dc_id_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::srv_config,std::allocator<nuraft::srv_config>,int&,int&,std::__cxx11::string&,std::__cxx11::string&,unsigned_char&,int&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->endpoint_,(srv_config **)this,
             (allocator<nuraft::srv_config> *)&local_75,&id,&dc_id,&local_48,&local_68,&is_learner,
             &priority);
  _Var4._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p);
    _Var4._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
    _Var4._M_pi = extraout_RDX_01;
  }
  pVar5.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  pVar5.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<srv_config>)pVar5.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<srv_config> srv_config::deserialize(buffer_serializer& bs) {
    int32 id = bs.get_i32();
    int32 dc_id = bs.get_i32();
    const char* endpoint_char = bs.get_cstr();
    const char* aux_char = bs.get_cstr();
    std::string endpoint( (endpoint_char) ? endpoint_char : std::string() );
    std::string aux( (aux_char) ? aux_char : std::string() );
    byte is_learner = bs.get_u8();
    int32 priority = bs.get_i32();
    return cs_new<srv_config>(id, dc_id, endpoint, aux, is_learner, priority);
}